

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

DependencyInfo *
helics::getExecEntryMinFederate
          (TimeDependencies *dependencies,GlobalFederateId self,ConnectionType ignoreType,
          GlobalFederateId ignore)

{
  TimeState TVar1;
  int iVar2;
  undefined6 uVar3;
  int iVar4;
  undefined8 in_RAX;
  DependencyInfo *pDVar5;
  DependencyInfo *pDVar6;
  TimeDependencies *__range1;
  undefined8 uStack_28;
  
  if ((getExecEntryMinFederate(helics::TimeDependencies_const&,helics::GlobalFederateId,helics::ConnectionType,helics::GlobalFederateId)
       ::maxDep == '\0') &&
     (uStack_28 = in_RAX,
     iVar4 = __cxa_guard_acquire(&getExecEntryMinFederate(helics::TimeDependencies_const&,helics::GlobalFederateId,helics::ConnectionType,helics::GlobalFederateId)
                                  ::maxDep), iVar4 != 0)) {
    uVar3 = (undefined6)uStack_28;
    uStack_28 = (ulong)CONCAT16(0x32,uVar3);
    DependencyInfo::DependencyInfo<helics::TimeState,unsigned_char>
              (&getExecEntryMinFederate::maxDep,(Time)0x7fffffffffffffff,
               (TimeState *)((long)&uStack_28 + 7),(uchar *)((long)&uStack_28 + 6));
    __cxa_guard_release(&getExecEntryMinFederate(helics::TimeDependencies_const&,helics::GlobalFederateId,helics::ConnectionType,helics::GlobalFederateId)
                         ::maxDep);
  }
  pDVar6 = (dependencies->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar5 = &getExecEntryMinFederate::maxDep;
  while( true ) {
    if (pDVar6 == (dependencies->dependencies).
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return pDVar5;
    }
    if ((((pDVar6->dependency == true) && (iVar4 = (pDVar6->fedID).gid, iVar4 != ignore.gid)) &&
        (pDVar6->connection != ignoreType && pDVar6->connection != SELF)) &&
       ((((self.gid == -2010000000 || (self.gid == -1700000000)) ||
         ((pDVar6->super_TimeData).minFedActual.gid != self.gid)) &&
        (((TVar1 = (pDVar6->super_TimeData).mTimeState, TVar1 < exec_requested &&
          ((pDVar6->super_TimeData).restrictionLevel <= (pDVar5->super_TimeData).restrictionLevel))
         && (((iVar2 = (pDVar5->fedID).gid, iVar2 == -2010000000 ||
              ((iVar2 == -1700000000 || (iVar4 < iVar2)))) &&
             (pDVar5 = pDVar6, TVar1 == initialized)))))))) break;
    pDVar6 = pDVar6 + 1;
  }
  return &getExecEntryMinFederate::maxDep;
}

Assistant:

const DependencyInfo& getExecEntryMinFederate(const TimeDependencies& dependencies,
                                              GlobalFederateId self,
                                              ConnectionType ignoreType,
                                              GlobalFederateId ignore)
{
    static const DependencyInfo maxDep{Time::maxVal(),
                                       TimeState::initialized,
                                       static_cast<std::uint8_t>(50U)};

    const DependencyInfo* minDep = &maxDep;

    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }
        if (dep.fedID == ignore) {
            continue;
        }
        if (dep.connection == ConnectionType::SELF || dep.connection == ignoreType) {
            continue;
        }
        if (self.isValid() && dep.minFedActual == self) {
            continue;
        }
        if (dep.mTimeState > TimeState::exec_requested_iterative) {
            continue;
        }
        if (dep.restrictionLevel > minDep->restrictionLevel) {
            continue;
        }
        if (!minDep->fedID.isValid() || dep.fedID < minDep->fedID) {
            minDep = &dep;
            if (minDep->mTimeState == TimeState::initialized) {
                minDep = &maxDep;
                break;
            }
        }
    }
    return *minDep;
}